

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec.c
# Opt level: O0

void bn_sub_modulus(u8 *a,u8 *N,u32 n)

{
  uint uVar1;
  bool local_25;
  uint uStack_20;
  u8 c;
  u32 dig;
  u32 i;
  u32 n_local;
  u8 *N_local;
  u8 *a_local;
  
  local_25 = false;
  for (uStack_20 = n - 1; uStack_20 < n; uStack_20 = uStack_20 - 1) {
    uVar1 = (uint)local_25;
    local_25 = (uint)a[uStack_20] < N[uStack_20] + uVar1;
    a[uStack_20] = a[uStack_20] - (char)(N[uStack_20] + uVar1);
  }
  return;
}

Assistant:

void bn_sub_modulus(u8 *a, u8 *N, u32 n)
{
	u32 i;
	u32 dig;
	u8 c;

	c = 0;
	for (i = n - 1; i < n; i--) {
		dig = N[i] + c;
		c = (a[i] < dig);
		a[i] -= dig;
	}
}